

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ws_audio.c
# Opt level: O0

void ws_audio_update(void *info,UINT32 length,DEV_SMPL **buffer)

{
  undefined4 uVar1;
  DEV_SMPL *pDVar2;
  DEV_SMPL *pDVar3;
  short sVar4;
  ushort uVar5;
  int iVar6;
  int iVar7;
  uint local_54;
  uint local_50;
  UINT32 XorReg;
  UINT32 Masked;
  UINT32 swpCount;
  DEV_SMPL r;
  DEV_SMPL l;
  INT16 w;
  UINT8 cnt;
  UINT8 ch;
  UINT32 i;
  DEV_SMPL *bufR;
  DEV_SMPL *bufL;
  wsa_state *chip;
  DEV_SMPL **buffer_local;
  UINT32 length_local;
  void *info_local;
  
  pDVar2 = *buffer;
  pDVar3 = buffer[1];
  for (l = 0; (uint)l < length; l = l + 1) {
    RC_STEP((RATIO_CNTR *)((long)info + 0x48));
    for (XorReg = RC_GET_VAL((RATIO_CNTR *)((long)info + 0x48)); XorReg != 0; XorReg = XorReg - 1) {
      ws_audio_process((wsa_state *)info);
    }
    RC_MASK((RATIO_CNTR *)((long)info + 0x48));
    Masked = 0;
    swpCount = 0;
    for (r._3_1_ = 0; r._3_1_ < 4; r._3_1_ = r._3_1_ + 1) {
      if (*(char *)((long)info + (ulong)r._3_1_ * 0x10 + 0x15) == '\0') {
        if ((r._3_1_ == 1) && ((*(byte *)((long)info + 0xfc) & 0x20) != 0)) {
          sVar4 = *(byte *)((long)info + 0xf5) - 0x80;
          swpCount = (uint)*(byte *)((long)info + 0x6a) * (int)sVar4 + swpCount;
          Masked = (uint)*(byte *)((long)info + 0x6b) * (int)sVar4 + Masked;
        }
        else if (((uint)*(byte *)((long)info + 0xfc) & 1 << (r._3_1_ & 0x1f)) != 0) {
          if ((r._3_1_ == 3) && ((*(byte *)((long)info + 0xfc) & 0x80) != 0)) {
            *(int *)((long)info + 0x3c) = *(int *)((long)info + 0x40) + *(int *)((long)info + 0x3c);
            r._2_1_ = (char)((uint)*(undefined4 *)((long)info + 0x3c) >> 0x10);
            *(uint *)((long)info + 0x3c) = *(uint *)((long)info + 0x3c) & 0xffff;
            while (r._2_1_ != '\0') {
              r._2_1_ = r._2_1_ + -1;
              *(UINT32 *)((long)info + 100) =
                   ws_audio_update::noise_bit[*(byte *)((long)info + 0x60)] - 1 &
                   *(uint *)((long)info + 100);
              if (*(int *)((long)info + 100) == 0) {
                *(UINT32 *)((long)info + 100) =
                     ws_audio_update::noise_bit[*(byte *)((long)info + 0x60)] - 1;
              }
              local_54 = 0;
              for (local_50 = *(uint *)((long)info + 100) &
                              ws_audio_update::noise_mask[*(byte *)((long)info + 0x60)];
                  local_50 != 0; local_50 = local_50 >> 1) {
                local_54 = local_50 & 1 ^ local_54;
              }
              if (local_54 != 0) {
                *(UINT32 *)((long)info + 100) =
                     ws_audio_update::noise_bit[*(byte *)((long)info + 0x60)] |
                     *(uint *)((long)info + 100);
              }
              *(uint *)((long)info + 100) = *(uint *)((long)info + 100) >> 1;
            }
            *(char *)((long)info + 0xfe) = (char)*(undefined4 *)((long)info + 100);
            *(byte *)((long)info + 0xff) =
                 (byte)((uint)*(undefined4 *)((long)info + 100) >> 8) & 0x7f;
            sVar4 = -0x80;
            if ((*(uint *)((long)info + 100) & 1) != 0) {
              sVar4 = 0x7f;
            }
            iVar6 = (uint)*(byte *)((long)info + 0x3a) * (int)sVar4;
            iVar7 = (uint)*(byte *)((long)info + 0x3b) * (int)sVar4;
          }
          else {
            *(int *)((long)info + (ulong)r._3_1_ * 0x10 + 0xc) =
                 *(int *)((long)info + (ulong)r._3_1_ * 0x10 + 0x10) +
                 *(int *)((long)info + (ulong)r._3_1_ * 0x10 + 0xc);
            uVar1 = *(undefined4 *)((long)info + (ulong)r._3_1_ * 0x10 + 0xc);
            *(uint *)((long)info + (ulong)r._3_1_ * 0x10 + 0xc) =
                 *(uint *)((long)info + (ulong)r._3_1_ * 0x10 + 0xc) & 0xffff;
            *(char *)((long)info + (ulong)r._3_1_ * 0x10 + 0x14) =
                 *(char *)((long)info + (ulong)r._3_1_ * 0x10 + 0x14) + (char)((uint)uVar1 >> 0x10);
            *(byte *)((long)info + (ulong)r._3_1_ * 0x10 + 0x14) =
                 *(byte *)((long)info + (ulong)r._3_1_ * 0x10 + 0x14) & 0x1f;
            uVar5 = (ushort)*(byte *)(*(long *)((long)info + 0x170) +
                                     (long)(int)((*(ushort *)
                                                   ((long)info + (ulong)r._3_1_ * 0x10 + 8) & 0xfff0
                                                 ) + ((int)(uint)*(byte *)((long)info +
                                                                          (ulong)r._3_1_ * 0x10 +
                                                                          0x14) >> 1)));
            if ((*(byte *)((long)info + (ulong)r._3_1_ * 0x10 + 0x14) & 1) == 0) {
              r._0_2_ = (uVar5 & 0xf) << 4;
            }
            else {
              r._0_2_ = uVar5 & 0xf0;
            }
            iVar6 = (uint)*(byte *)((long)info + (ulong)r._3_1_ * 0x10 + 10) *
                    (int)(short)((ushort)r - 0x80);
            iVar7 = (uint)*(byte *)((long)info + (ulong)r._3_1_ * 0x10 + 0xb) *
                    (int)(short)((ushort)r - 0x80);
          }
          swpCount = iVar6 + swpCount;
          Masked = iVar7 + Masked;
        }
      }
    }
    pDVar2[(uint)l] = swpCount * *(ushort *)((long)info + 0x68);
    pDVar3[(uint)l] = Masked * *(ushort *)((long)info + 0x68);
  }
  return;
}

Assistant:

static void ws_audio_update(void* info, UINT32 length, DEV_SMPL** buffer)
{
	wsa_state* chip = (wsa_state*)info;
	DEV_SMPL* bufL;
	DEV_SMPL* bufR;
	UINT32 i;
	UINT8 ch, cnt;
	INT16 w;	// could fit into INT8
	DEV_SMPL l, r;

	bufL = buffer[0];
	bufR = buffer[1];
	for (i=0; i<length; i++)
	{
		UINT32 swpCount;
		
		RC_STEP(&chip->HBlankTmr);
		for (swpCount = RC_GET_VAL(&chip->HBlankTmr); swpCount > 0; swpCount --)
			ws_audio_process(chip);
		RC_MASK(&chip->HBlankTmr);

		l = r = 0;

		for (ch=0; ch<4; ch++)
		{
			if (chip->ws_audio[ch].Muted)
				continue;
			
			if ((ch==1) && (SNDMOD&0x20))
			{
				// Voice出力
				w = chip->ws_ioRam[0x89];
				w -= 0x80;
				l += chip->PCMVolumeLeft  * w;
				r += chip->PCMVolumeRight * w;
			}
			else if (SNDMOD&(1<<ch))
			{
				if ((ch==3) && (SNDMOD&0x80))
				{
					//Noise

					//OSWANの擬似乱数の処理と同等のつもり
#define BIT(n) (1<<n)
					static const UINT32 noise_mask[8] =
					{
						BIT(0)|BIT(1),
						BIT(0)|BIT(1)|BIT(4)|BIT(5),
						BIT(0)|BIT(1)|BIT(3)|BIT(4),
						BIT(0)|BIT(1)|BIT(4)|BIT(6),
						BIT(0)|BIT(2),
						BIT(0)|BIT(3),
						BIT(0)|BIT(4),
						BIT(0)|BIT(2)|BIT(3)|BIT(4)
					};

					static const UINT32 noise_bit[8] =
					{
						BIT(15),
						BIT(14),
						BIT(13),
						BIT(12),
						BIT(11),
						BIT(10),
						BIT(9),
						BIT(8)
					};

					UINT32 Masked, XorReg;

					chip->ws_audio[ch].offset += chip->ws_audio[ch].delta;
					cnt = chip->ws_audio[ch].offset>>16;
					chip->ws_audio[ch].offset &= 0xffff;
					while (cnt > 0)
					{
						cnt--;

						chip->NoiseRng &= noise_bit[chip->NoiseType]-1;
						if (!chip->NoiseRng) chip->NoiseRng = noise_bit[chip->NoiseType]-1;

						Masked = chip->NoiseRng & noise_mask[chip->NoiseType];
						XorReg = 0;
						while (Masked)
						{
							XorReg ^= Masked&1;
							Masked >>= 1;
						}
						if (XorReg)
							chip->NoiseRng |= noise_bit[chip->NoiseType];
						chip->NoiseRng >>= 1;
					}

					PCSRL = (byte)(chip->NoiseRng&0xff);
					PCSRH = (byte)((chip->NoiseRng>>8)&0x7f);

					w = (chip->NoiseRng&1)? 0x7f:-0x80;
					l += chip->ws_audio[ch].lvol * w;
					r += chip->ws_audio[ch].rvol * w;
				}
				else
				{
					chip->ws_audio[ch].offset += chip->ws_audio[ch].delta;
					cnt = chip->ws_audio[ch].offset>>16;
					chip->ws_audio[ch].offset &= 0xffff;
					chip->ws_audio[ch].pos += cnt;
					chip->ws_audio[ch].pos &= 0x1f;
					w = chip->ws_internalRam[(chip->ws_audio[ch].wave&0xFFF0) + (chip->ws_audio[ch].pos>>1)];
					if ((chip->ws_audio[ch].pos&1) == 0)
						w = (w<<4)&0xf0;	//下位ニブル
					else
						w = w&0xf0;			//上位ニブル
					w -= 0x80;
					l += chip->ws_audio[ch].lvol * w;
					r += chip->ws_audio[ch].rvol * w;
				}
			}
		}

		bufL[i] = l * chip->MainVolume;
		bufR[i] = r * chip->MainVolume;
	}
}